

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
::operator=(result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            *this,result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
                  *other)

{
  if (this->is_ok_ == true) {
    detail::region<std::vector<char,_std::allocator<char>_>_>::~region(&(this->field_1).succ.value);
  }
  if (other->is_ok_ == true) {
    detail::region<std::vector<char,_std::allocator<char>_>_>::region
              (&(this->field_1).succ.value,&(other->field_1).succ.value);
  }
  this->is_ok_ = other->is_ok_;
  return this;
}

Assistant:

result& operator=(result&& other)
    {
        this->cleanup();
        if(other.is_ok())
        {
            auto tmp = ::new(std::addressof(this->succ)) success_type(std::move(other.as_ok()));
            assert(tmp == std::addressof(this->succ));
            (void)tmp;
        }
        else
        {
            auto tmp = ::new(std::addressof(this->fail)) failure_type(std::move(other.as_err()));
            assert(tmp == std::addressof(this->fail));
            (void)tmp;
        }
        is_ok_ = other.is_ok();
        return *this;
    }